

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O2

void __thiscall Movegen::generate<(Movetype)10,(Piece)4>(Movegen *this)

{
  U64 UVar1;
  U64 UVar2;
  Square *s;
  U64 mvs;
  Square local_3c;
  ulong local_38;
  
  for (s = this->queens; *s != no_square; s = s + 1) {
    UVar1 = magics::attacks<(Piece)2>(&this->all_pieces,s);
    UVar2 = magics::attacks<(Piece)3>(&this->all_pieces,s);
    local_38 = (UVar2 | UVar1) & this->qtarget;
    if (local_38 != 0) {
      local_3c = *s;
      encode<(Movetype)10>(this,&local_38,(int *)&local_3c);
    }
  }
  return;
}

Assistant:

inline void Movegen::generate<quiet, queen>() {
	for (Square* s = &queens[0]; *s != no_square; ++s) {
		U64 mvs = (magics::attacks<bishop>(all_pieces, *s) |
			magics::attacks<rook>(all_pieces, *s)) & qtarget;
		if (mvs != 0ULL) encode<quiet>(mvs, *s);
	}
}